

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O2

int testFileWriterTestsNoAccess(void)

{
  string *__lhs;
  ostream *poVar1;
  AutoDeleteTempFile tmpDir;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  FileWriter local_228;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileName,"",(allocator<char> *)&tmpDir);
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tmpDir,DIR);
  __lhs = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tmpDir);
  std::operator+(&local_248,__lhs,"/weight.wt");
  std::__cxx11::string::operator=((string *)&fileName,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tmpDir);
  MILBlob::Blob::FileWriter::FileWriter(&local_228,&fileName,true);
  MILBlob::Blob::FileWriter::~FileWriter(&local_228);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x25);
  std::operator<<(poVar1,": expected exception, but none thrown.\n");
  std::__cxx11::string::~string((string *)&fileName);
  return 1;
}

Assistant:

int testFileWriterTestsNoAccess()
{
    std::string fileName = "";
    {
        AutoDeleteTempFile tmpDir(AutoDeleteTempFile::FileType::DIR);
        fileName = tmpDir.GetFilename() + "/weight.wt";
    }
    ML_ASSERT_THROWS_WITH_MESSAGE(FileWriter(fileName, /* truncateFile */ true), std::runtime_error, "Unable to open");

    return 0;
}